

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap_secure.hpp
# Opt level: O2

Error * __thiscall
ot::commissioner::coap::CoapSecure::GetLocalAddr
          (Error *__return_storage_ptr__,CoapSecure *this,Address *aAddr)

{
  element_type *peVar1;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  string local_70;
  undefined1 local_50 [40];
  undefined1 local_28 [16];
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  peVar1 = (this->mSocket).
           super___shared_ptr<ot::commissioner::UdpSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((peVar1->super_Socket).mIsConnected == false) {
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_28;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_70,(v10 *)"socket is not connected",(string_view)ZEXT816(0x17),args);
    local_50._0_4_ = kInvalidState;
    std::__cxx11::string::string((string *)(local_50 + 8),(string *)&local_70);
    Error::operator=(__return_storage_ptr__,(Error *)local_50);
    std::__cxx11::string::~string((string *)(local_50 + 8));
    std::__cxx11::string::~string((string *)&local_70);
  }
  else {
    (*(peVar1->super_Socket)._vptr_Socket[3])(local_50);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              (&aAddr->mBytes,
               (_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

Error GetLocalAddr(Address &aAddr) const
    {
        Error error;

        VerifyOrExit(mSocket->IsConnected(), error = ERROR_INVALID_STATE("socket is not connected"));
        aAddr = mSocket->GetLocalAddr();

    exit:
        return error;
    }